

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

Matrix4x4 * __thiscall
CMU462::DynamicScene::Joint::getTransformation(Matrix4x4 *__return_storage_ptr__,Joint *this)

{
  Joint *this_local;
  Matrix4x4 *T;
  
  Matrix4x4::identity();
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Joint::getTransformation()
   {
     /* Implement Me! (Task 2a)
     Initialize a 4x4 identity transformation matrix. Traverse the hierarchy starting from the parent of 
     this joint all the way up to the root (root has parent of nullptr) and accumulate their transformations 
     on the left side of your transformation matrix. Don't forget to apply a translation which extends along 
     the axis of those joints. Finally, apply the mesh's transformation at the end.
     */
     Matrix4x4 T = Matrix4x4::identity();

     return T;
   }